

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O2

Var Js::JavascriptBigInt::Sub(Var aLeft,Var aRight)

{
  JavascriptBigInt *pJVar1;
  JavascriptBigInt *pJVar2;
  
  pJVar1 = VarTo<Js::JavascriptBigInt>(aLeft);
  pJVar2 = VarTo<Js::JavascriptBigInt>(aRight);
  pJVar1 = New(pJVar1,(((((pJVar1->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                      super_JavascriptLibraryBase).scriptContext.ptr);
  pJVar2 = New(pJVar2,(((((pJVar2->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                      super_JavascriptLibraryBase).scriptContext.ptr);
  pJVar1 = Sub(pJVar1,pJVar2);
  return pJVar1;
}

Assistant:

Var JavascriptBigInt::Sub(Var aLeft, Var aRight)
    {
        JavascriptBigInt *leftBigInt = VarTo<JavascriptBigInt>(aLeft);
        JavascriptBigInt *rightBigInt = VarTo<JavascriptBigInt>(aRight);
        return JavascriptBigInt::Sub(JavascriptBigInt::New(leftBigInt, leftBigInt->GetScriptContext()), JavascriptBigInt::New(rightBigInt, rightBigInt->GetScriptContext()));
        // TODO: Consider deferring creation of new instances until we need them
    }